

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O1

string * __thiscall
calculator::Token::toString_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  Tag *__k;
  pointer pcVar1;
  __node_base_ptr p_Var2;
  mapped_type *pmVar3;
  
  __k = &this->__tag;
  p_Var2 = std::
           _Hashtable<calculator::Tag,_std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<calculator::Tag>,_std::hash<calculator::Tag>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->tagTable)._M_h,
                      (ulong)(long)(int)this->__tag % (this->tagTable)._M_h._M_bucket_count,__k,
                      (long)(int)this->__tag);
  if ((p_Var2 == (__node_base_ptr)0x0) || (p_Var2->_M_nxt == (_Hash_node_base *)0x0)) {
    if (*__k == Other) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
  }
  else {
    pmVar3 = std::__detail::
             _Map_base<calculator::Tag,_std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<calculator::Tag>,_std::hash<calculator::Tag>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<calculator::Tag,_std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<calculator::Tag>,_std::hash<calculator::Tag>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->tagTable,__k);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pmVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pmVar3->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString() {
        if (tagTable.find(__tag) != tagTable.end())
            return tagTable[__tag];
        else if (__tag == Tag::Other) {
            return std::string(1, static_cast<char>(__c));
        } else
            return "";
    }